

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# case.c
# Opt level: O0

void ucase(char *cp)

{
  char cVar1;
  char *local_10;
  char *cp_local;
  
  local_10 = cp;
  if (cp != (char *)0x0) {
    for (; *local_10 != '\0'; local_10 = local_10 + 1) {
      if ((*local_10 < 'a') || ('z' < *local_10)) {
        cVar1 = *local_10;
      }
      else {
        cVar1 = *local_10 + -0x20;
      }
      *local_10 = cVar1;
    }
  }
  return;
}

Assistant:

void
ucase(register char *cp)
{
    if (cp) {
        while (*cp) {
            *cp = UPPER_CASE(*cp);
            cp++;
        }
    }
}